

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

Vec_Int_t * Cba_NtkCollectDfs(Cba_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar3 = (p->vObjType).nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar3 - 2U) {
    iVar6 = iVar3 + -1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar4;
  if (0 < (p->vInputs).nSize) {
    lVar7 = 0;
    do {
      Vec_IntPush(p_00,(p->vInputs).pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vInputs).nSize);
  }
  if (0 < (p->vSeq).nSize) {
    lVar7 = 0;
    do {
      Vec_IntPush(p_00,(p->vSeq).pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vSeq).nSize);
  }
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar1) {
    piVar4 = (p->vObjCopy).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vObjCopy).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vObjCopy).nSize = uVar1;
  iVar3 = p_00->nSize;
  if (0 < (long)iVar3) {
    piVar4 = p_00->pArray;
    lVar7 = 0;
    do {
      Cba_ObjSetCopy(p,piVar4[lVar7],0);
      lVar7 = lVar7 + 1;
    } while (iVar3 != lVar7);
  }
  iVar3 = (p->vOutputs).nSize;
  if (0 < iVar3) {
    lVar7 = 0;
    do {
      uVar1 = (p->vOutputs).pArray[lVar7];
      if ((int)uVar1 < 1) goto LAB_00335302;
      uVar8 = (p->vObjFin0).nSize;
      if (((int)uVar8 <= (int)uVar1) || (uVar8 <= uVar1 + 1)) goto LAB_003352c4;
      uVar2 = (p->vObjFin0).pArray[uVar1];
      uVar9 = (ulong)uVar2;
      while ((int)uVar9 < (p->vObjFin0).pArray[(ulong)uVar1 + 1]) {
        if ((int)uVar2 < 1) goto LAB_003352e3;
        if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003352c4;
        iVar3 = (p->vFinFon).pArray[uVar9];
        if (0 < (long)iVar3) {
          if ((p->vFonObj).nSize <= iVar3) goto LAB_003352c4;
          iVar3 = (p->vFonObj).pArray[iVar3];
          if (iVar3 != 0) {
            Cba_NtkCollectDfs_rec(p,iVar3,p_00);
            uVar8 = (p->vObjFin0).nSize;
          }
        }
        uVar9 = uVar9 + 1;
        if ((int)uVar8 <= (int)(uVar1 + 1)) goto LAB_003352c4;
      }
      lVar7 = lVar7 + 1;
      iVar3 = (p->vOutputs).nSize;
    } while (lVar7 < iVar3);
  }
  if (0 < (p->vSeq).nSize) {
    lVar7 = 0;
    do {
      uVar1 = (p->vSeq).pArray[lVar7];
      if ((int)uVar1 < 1) {
LAB_00335302:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x154,"int Cba_ObjFin0(Cba_Ntk_t *, int)");
      }
      uVar8 = (p->vObjFin0).nSize;
      if (((int)uVar8 <= (int)uVar1) || (uVar8 <= uVar1 + 1)) goto LAB_003352c4;
      uVar2 = (p->vObjFin0).pArray[uVar1];
      uVar9 = (ulong)uVar2;
      while ((int)uVar9 < (p->vObjFin0).pArray[(ulong)uVar1 + 1]) {
        if ((int)uVar2 < 1) {
LAB_003352e3:
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003352c4;
        iVar3 = (p->vFinFon).pArray[uVar9];
        if (0 < (long)iVar3) {
          if ((p->vFonObj).nSize <= iVar3) goto LAB_003352c4;
          iVar3 = (p->vFonObj).pArray[iVar3];
          if (iVar3 != 0) {
            Cba_NtkCollectDfs_rec(p,iVar3,p_00);
            uVar8 = (p->vObjFin0).nSize;
          }
        }
        uVar9 = uVar9 + 1;
        if ((int)uVar8 <= (int)(uVar1 + 1)) goto LAB_003352c4;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vSeq).nSize);
    iVar3 = (p->vOutputs).nSize;
  }
  if (0 < iVar3) {
    lVar7 = 0;
    do {
      Vec_IntPush(p_00,(p->vOutputs).pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vOutputs).nSize);
  }
  uVar1 = p_00->nSize;
  iVar3 = (p->vObjType).nSize;
  if (iVar3 <= (int)uVar1) {
    __assert_fail("Vec_IntSize(vObjs) <= Cba_NtkObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x296,"Vec_Int_t *Cba_NtkCollectDfs(Cba_Ntk_t *)");
  }
  uVar8 = iVar3 - 1;
  if (uVar1 != uVar8) {
    uVar8 = Cba_NtkFindMissing(p_00,uVar8);
    pcVar5 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
    printf("Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n",pcVar5,
           (ulong)uVar1,(ulong)((p->vObjType).nSize - 1));
    if ((int)uVar8 < 1) {
      pcVar5 = "<unknown>";
    }
    else {
      if ((p->vObjFon0).nSize <= (int)uVar8) {
LAB_003352c4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vFonName).nSize < 1) {
        pcVar5 = "Cba_NtkHasFonNames(p)";
LAB_0033536f:
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
      }
      uVar1 = (p->vObjFon0).pArray[uVar8];
      if ((int)uVar1 < 1) {
        pcVar5 = "Cba_FonIsReal(f)";
        goto LAB_0033536f;
      }
      Vec_IntFillExtra(&p->vFonName,uVar1 + 1,0);
      if ((p->vFonName).nSize <= (int)uVar1) goto LAB_003352c4;
      pcVar5 = Abc_NamStr(p->pDesign->pStrs,(p->vFonName).pArray[uVar1]);
    }
    printf("         For example, object %d with name \"%s\" is not reachable from outputs.\n",
           (ulong)uVar8,pcVar5);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectDfs( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin;
    Vec_Int_t * vObjs = Vec_IntAlloc( Cba_NtkObjNum(p) );
    // collect PIs and seq boxes
    Cba_NtkForEachPi( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    // prepare leaves
    Cba_NtkCleanObjCopies( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjSetCopy( p, iObj, 0 );
    // collect internal
    Cba_NtkForEachPo( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    // collect POs
    Cba_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    assert( Vec_IntSize(vObjs) <= Cba_NtkObjNum(p) );
    if ( Vec_IntSize(vObjs) != Cba_NtkObjNum(p) )
    {
        int iObj = Cba_NtkFindMissing( vObjs, Cba_NtkObjNum(p) );
        printf( "Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n", Cba_NtkName(p), Vec_IntSize(vObjs), Cba_NtkObjNum(p) );
        printf( "         For example, object %d with name \"%s\" is not reachable from outputs.\n", 
            iObj, iObj > 0 ? Cba_FonNameStr( p, Cba_ObjFon0(p, iObj) ) : "<unknown>" );
    }
    return vObjs;
}